

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void __thiscall
GEO::Cavity::new_facet
          (Cavity *this,index_t tglobal,index_t boundary_f,signed_index_t v0,signed_index_t v1,
          signed_index_t v2)

{
  uint uVar1;
  local_index_t f;
  
  if (this->OK_ == true) {
    uVar1 = this->nb_f_;
    if (uVar1 == 0x80) {
      this->OK_ = false;
    }
    else {
      f = (local_index_t)uVar1;
      set_vv2t(this,v0,v1,f);
      set_vv2t(this,v1,v2,f);
      set_vv2t(this,v2,v0,f);
      if (this->OK_ == true) {
        this->nb_f_ = this->nb_f_ + 1;
        uVar1 = uVar1 & 0xff;
        this->tglobal_[uVar1] = tglobal;
        this->boundary_f_[uVar1] = boundary_f;
        this->f2v_[uVar1][0] = v0;
        this->f2v_[uVar1][1] = v1;
        this->f2v_[uVar1][2] = v2;
      }
    }
  }
  return;
}

Assistant:

void new_facet(
	    index_t tglobal, index_t boundary_f,
	    signed_index_t v0, signed_index_t v1, signed_index_t v2
	) {
	    if(!OK_) {
		return;
	    }
	    
	    geo_debug_assert(v0 != v1);
	    geo_debug_assert(v1 != v2);
	    geo_debug_assert(v2 != v0);	    

	    local_index_t new_t = local_index_t(nb_f_);
	    
	    if(nb_f_ == MAX_F) {
		OK_ = false;
		return;
	    }
	    
	    set_vv2t(v0, v1, new_t);
	    set_vv2t(v1, v2, new_t);
	    set_vv2t(v2, v0, new_t);
	    
	    if(!OK_) {
		return;
	    }
	    
	    ++nb_f_;
	    tglobal_[new_t] = tglobal;
	    boundary_f_[new_t] = boundary_f;
	    f2v_[new_t][0] = v0;
	    f2v_[new_t][1] = v1;
	    f2v_[new_t][2] = v2;
	}